

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

OneofOptions * __thiscall google::protobuf::OneofOptions::New(OneofOptions *this,Arena *arena)

{
  OneofOptions *this_00;
  
  this_00 = (OneofOptions *)operator_new(0x68);
  OneofOptions(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::OneofOptions>(arena,this_00);
  }
  return this_00;
}

Assistant:

OneofOptions* OneofOptions::New(::google::protobuf::Arena* arena) const {
  OneofOptions* n = new OneofOptions;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}